

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O1

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLNodeLinOp::getSolvabilityOffset
          (Vector<double,_std::allocator<double>_> *__return_storage_ptr__,MLNodeLinOp *this,
          int amrlev,int mglev,Any *a_rhs)

{
  Array4<const_double> *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  undefined8 this_00;
  uint uVar12;
  FabArray<amrex::FArrayBox> *this_01;
  int *piVar13;
  long lVar14;
  Array4<const_double> *pAVar15;
  IndexType IVar16;
  FabArray<amrex::FArrayBox> *this_02;
  bool bVar17;
  pointer pBVar18;
  pointer pBVar19;
  initializer_list<std::reference_wrapper<double>_> __l;
  initializer_list<double> __l_00;
  gpu_tuple_impl<0UL,_double,_double> gVar20;
  ReduceOps<amrex::ReduceOpSum,_amrex::ReduceOpSum> reduce_op;
  Real s2;
  Real s1;
  MFIter mfi;
  ReduceOps<amrex::ReduceOpSum,_amrex::ReduceOpSum> local_165;
  uint local_164;
  ulong local_160;
  gpu_tuple_element<0UL,_double> local_158;
  gpu_tuple_element<1UL,_double> local_150;
  int local_144;
  IndexType local_140;
  IntVect local_13c;
  undefined1 local_130 [80];
  element_type *local_e0;
  element_type *local_d0;
  undefined1 local_c8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  MFIter local_a8;
  vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_> local_48;
  
  local_130._32_8_ = __return_storage_ptr__;
  this_01 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
  this_02 = &(this->m_bottom_dot_mask).super_FabArray<amrex::FArrayBox>;
  if (mglev + 1 !=
      *(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    this_02 = &(this->m_coarse_dot_mask).super_FabArray<amrex::FArrayBox>;
  }
  FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>(this_02);
  local_130._48_8_ = (this_02->m_const_arrays).hp;
  FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>(this_01);
  local_130._40_8_ = (this_01->m_const_arrays).hp;
  local_13c.vect[0] = 0;
  local_13c.vect[1] = 0;
  local_13c.vect[2] = 0;
  ReduceData<double,double>::ReduceData<amrex::ReduceOpSum,amrex::ReduceOpSum>
            ((ReduceData<double,double> *)&local_e0,&local_165);
  MFIter::MFIter(&local_a8,&this_01->super_FabArrayBase,true);
  if (local_a8.currentIndex < local_a8.endIndex) {
    do {
      MFIter::growntilebox((Box *)local_130,&local_a8,&local_13c);
      piVar13 = &local_a8.currentIndex;
      if (local_a8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar13 = ((local_a8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_a8.currentIndex;
      }
      local_144 = local_130._20_4_;
      local_160 = (ulong)(uint)local_130._8_4_;
      if ((int)local_130._8_4_ <= (int)local_130._20_4_) {
        local_164 = local_130._4_4_;
        local_130._64_8_ = SEXT48((int)local_130._0_4_);
        pAVar1 = (Array4<const_double> *)(local_130._48_8_ + (long)*piVar13 * 0x40);
        pAVar15 = (Array4<const_double> *)((long)*piVar13 * 0x40 + local_130._40_8_);
        local_130._56_8_ = local_130._64_8_ * 8;
        local_140.itype = local_130._12_4_;
        do {
          if ((int)local_130._4_4_ <= (int)local_130._16_4_) {
            local_130._72_8_ = SEXT48((int)local_160);
            IVar16.itype = local_130._4_4_;
            do {
              if ((int)local_130._0_4_ <= (int)local_130._12_4_) {
                iVar2 = (pAVar1->begin).x;
                local_150.m_value = (double)(long)(pAVar1->begin).y;
                local_158.m_value = (double)(long)(pAVar1->begin).z;
                iVar3 = (pAVar15->begin).x;
                iVar4 = (pAVar15->begin).y;
                iVar5 = (pAVar15->begin).z;
                pBVar18 = (local_e0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pBVar19 = (local_e0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                pdVar6 = pAVar15->p;
                lVar7 = pAVar15->kstride;
                lVar8 = pAVar15->jstride;
                pdVar9 = pAVar1->p;
                lVar10 = pAVar1->kstride;
                lVar11 = pAVar1->jstride;
                lVar14 = 0;
                do {
                  pBVar18 = (pointer)((double)pBVar18 +
                                     pdVar9[local_130._64_8_ +
                                            (((local_130._72_8_ - (long)local_158.m_value) * lVar10
                                             + ((long)(int)IVar16.itype - (long)local_150.m_value) *
                                               lVar11 + lVar14) - (long)iVar2)]);
                  pBVar19 = (pointer)((double)pBVar19 +
                                     pdVar6[local_130._64_8_ +
                                            ((((long)(int)IVar16.itype - (long)iVar4) * lVar8 +
                                             (local_130._72_8_ - (long)iVar5) * lVar7 + lVar14) -
                                            (long)iVar3)] *
                                     pdVar9[local_130._64_8_ +
                                            (((local_130._72_8_ - (long)local_158.m_value) * lVar10
                                             + ((long)(int)IVar16.itype - (long)local_150.m_value) *
                                               lVar11 + lVar14) - (long)iVar2)]);
                  (local_e0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start = pBVar18;
                  (local_e0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish = pBVar19;
                  lVar14 = lVar14 + 1;
                } while ((local_130._12_4_ - local_130._0_4_) + 1 != (int)lVar14);
              }
              bVar17 = IVar16.itype != local_130._16_4_;
              IVar16.itype = IVar16.itype + 1;
            } while (bVar17);
          }
          uVar12 = (int)local_160 + 1;
          bVar17 = (int)local_160 != local_130._20_4_;
          local_160 = (ulong)uVar12;
        } while (bVar17);
      }
      MFIter::operator++(&local_a8);
    } while (local_a8.currentIndex < local_a8.endIndex);
  }
  MFIter::~MFIter(&local_a8);
  gVar20 = (gpu_tuple_impl<0UL,_double,_double>)
           ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum>::value<amrex::ReduceData<double,double>>
                     ((ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum> *)&local_165,
                      (ReduceData<double,_double> *)&local_e0);
  local_158 = gVar20.super_gpu_tuple_element<0UL,_double>.m_value;
  local_150.m_value =
       (double)gVar20.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value
  ;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_b8._M_pi)(local_c8,local_c8,3);
    gVar20.super_gpu_tuple_element<0UL,_double>.m_value = local_158.m_value;
    gVar20.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value =
         (gpu_tuple_element<1UL,_double>)(gpu_tuple_element<1UL,_double>)local_150.m_value;
  }
  local_158 = gVar20.super_gpu_tuple_element<0UL,_double>.m_value;
  local_150.m_value =
       (double)gVar20.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value
  ;
  if (local_e0 != (element_type *)0x0) {
    operator_delete(local_e0,(long)local_d0 - (long)local_e0);
    gVar20.super_gpu_tuple_element<0UL,_double>.m_value = local_158.m_value;
    gVar20.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value =
         (gpu_tuple_element<1UL,_double>)(gpu_tuple_element<1UL,_double>)local_150.m_value;
  }
  local_158 = gVar20.super_gpu_tuple_element<0UL,_double>.m_value;
  local_150.m_value =
       (double)gVar20.super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value
  ;
  local_e0 = (element_type *)local_158.m_value;
  local_a8.fabArray = (FabArrayBase *)local_130;
  local_130._0_8_ = local_150.m_value;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_a8;
  local_a8.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       &local_e0;
  std::vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
  vector(&local_48,__l,(allocator_type *)&local_13c);
  this_00 = local_130._32_8_;
  if (local_48.
      super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_a8.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       ((double)local_e0 / (double)local_130._0_8_);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_a8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00,__l_00,(allocator_type *)&local_13c)
  ;
  return (Vector<double,_std::allocator<double>_> *)
         (vector<double,_std::allocator<double>_> *)this_00;
}

Assistant:

Vector<Real>
MLNodeLinOp::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    amrex::ignore_unused(amrlev);
    AMREX_ASSERT(amrlev==0 && (mglev+1==m_num_mg_levels[0] || mglev==0));
    AMREX_ASSERT(getNComp() == 1);

    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto const& rhs = a_rhs.get<MultiFab>();

    const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
    const auto& mask_ma = mask.const_arrays();
    const auto& rhs_ma = rhs.const_arrays();
    auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                       rhs, IntVect(0),
                       [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                           -> GpuTuple<Real,Real>
                       {
                           return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                    mask_ma[box_no](i,j,k) };
                       });

    Real s1 = amrex::get<0>(r);
    Real s2 = amrex::get<1>(r);
    ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
    return {s1/s2};
}